

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_string_parser.c
# Opt level: O0

MAP_HANDLE connectionstringparser_parse_from_char(char *connection_string)

{
  STRING_HANDLE connection_string_00;
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  STRING_HANDLE connString;
  MAP_HANDLE result;
  char *connection_string_local;
  
  connection_string_00 = STRING_construct(connection_string);
  if (connection_string_00 == (STRING_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/connection_string_parser.c"
                ,"connectionstringparser_parse_from_char",0x16,1,
                "Error constructing connection String");
    }
    connString = (STRING_HANDLE)0x0;
  }
  else {
    connString = (STRING_HANDLE)connectionstringparser_parse(connection_string_00);
    STRING_delete(connection_string_00);
  }
  return (MAP_HANDLE)connString;
}

Assistant:

MAP_HANDLE connectionstringparser_parse_from_char(const char* connection_string)
{
    MAP_HANDLE result;
    STRING_HANDLE connString = NULL;

    /* Codes_SRS_CONNECTIONSTRINGPARSER_21_020: [connectionstringparser_parse_from_char shall create a STRING_HANDLE from the connection_string passed in as argument and parse it using the connectionstringparser_parse.]*/
    if ((connString = STRING_construct(connection_string)) == NULL)
    {
        /* Codes_SRS_CONNECTIONSTRINGPARSER_21_021: [If connectionstringparser_parse_from_char get error creating a STRING_HANDLE, it shall return NULL.]*/
        LogError("Error constructing connection String");
        result = NULL;
    }
    else
    {
        result = connectionstringparser_parse(connString);
        STRING_delete(connString);
    }

    return result;
}